

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O2

void planck_unit_print_postamble_summary(planck_unit_suite_t *suite)

{
  planck_unit_test_t *ppVar1;
  int __c;
  planck_unit_test_t **pppVar2;
  
  putchar(10);
  fflush(_stdout);
  pppVar2 = &suite->head;
  while (ppVar1 = *pppVar2, ppVar1 != (planck_unit_test_t *)0x0) {
    __c = 0x2a;
    if (ppVar1->result != '\x01') {
      __c = 0x46;
    }
    putchar(__c);
    fflush(_stdout);
    pppVar2 = &ppVar1->next;
  }
  printf("\n\nTotal Passed:\t\t%d\n",(ulong)(uint)suite->total_passed);
  fflush(_stdout);
  printf("Total Tests:\t\t%d\n",(ulong)(uint)suite->total_tests);
  fflush(_stdout);
  printf("Total Time Spent:\t%lu ms\n",suite->total_time);
  fflush(_stdout);
  return;
}

Assistant:

void
planck_unit_print_postamble_summary(
	planck_unit_suite_t *suite
) {
	planck_unit_test_t *state;

	PLANCK_UNIT_PRINT_STR("\n");
	state = suite->head;

	while (NULL != state) {
		if (PLANCK_UNIT_SUCCESS == state->result) {
			PLANCK_UNIT_PRINT_STR("*");
		}
		else {
			PLANCK_UNIT_PRINT_STR("F");
		}

		state = state->next;
	}

	printf("\n\nTotal Passed:\t\t%d\n", suite->total_passed);
	PLANCK_UNIT_FLUSH;

	printf("Total Tests:\t\t%d\n", suite->total_tests);
	PLANCK_UNIT_FLUSH;

	printf("Total Time Spent:\t%lu ms\n", suite->total_time);
	PLANCK_UNIT_FLUSH;
}